

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

void tcpnodelay(connectdata *conn,curl_socket_t sockfd)

{
  SessionHandle *data_00;
  connectdata *conn_00;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint local_24;
  int level;
  curl_socklen_t onoff;
  SessionHandle *data;
  connectdata *pcStack_10;
  curl_socket_t sockfd_local;
  connectdata *conn_local;
  
  _level = conn->data;
  local_24 = (uint)((_level->set).tcp_nodelay & 1);
  data._4_4_ = sockfd;
  pcStack_10 = conn;
  iVar1 = setsockopt(sockfd,6,1,&local_24,4);
  conn_00 = pcStack_10;
  data_00 = _level;
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    pcVar3 = Curl_strerror(conn_00,*piVar2);
    Curl_infof(data_00,"Could not set TCP_NODELAY: %s\n",pcVar3);
  }
  else {
    Curl_infof(_level,"TCP_NODELAY set\n");
  }
  return;
}

Assistant:

static void tcpnodelay(struct connectdata *conn,
                       curl_socket_t sockfd)
{
#ifdef TCP_NODELAY
  struct SessionHandle *data= conn->data;
  curl_socklen_t onoff = (curl_socklen_t) data->set.tcp_nodelay;
  int level = IPPROTO_TCP;

#if 0
  /* The use of getprotobyname() is disabled since it isn't thread-safe on
     numerous systems. On these getprotobyname_r() should be used instead, but
     that exists in at least one 4 arg version and one 5 arg version, and
     since the proto number rarely changes anyway we now just use the hard
     coded number. The "proper" fix would need a configure check for the
     correct function much in the same style the gethostbyname_r versions are
     detected. */
  struct protoent *pe = getprotobyname("tcp");
  if(pe)
    level = pe->p_proto;
#endif

  if(setsockopt(sockfd, level, TCP_NODELAY, (void *)&onoff,
                sizeof(onoff)) < 0)
    infof(data, "Could not set TCP_NODELAY: %s\n",
          Curl_strerror(conn, SOCKERRNO));
  else
    infof(data,"TCP_NODELAY set\n");
#else
  (void)conn;
  (void)sockfd;
#endif
}